

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall LinearScan::CheckInvariants(LinearScan *this)

{
  RegNum RVar1;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  Type pSVar3;
  StackSym *this_00;
  long lVar4;
  code *pcVar5;
  NodeBase *pNVar6;
  bool bVar7;
  BVIndex BVar8;
  undefined4 *puVar9;
  Type *ppLVar10;
  int iVar11;
  Type pSVar12;
  int iVar13;
  uint32 uVar14;
  int i;
  ulong uVar15;
  undefined1 local_48 [8];
  Iterator __iter;
  
  pSVar12 = (Type)(this->nonAllocatableRegs).word;
  local_48 = (undefined1  [8])this->activeLiveranges;
  __iter.list = (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_48;
  __iter.current = (NodeBase *)this;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  uVar14 = 0;
  while( true ) {
    if (__iter.list == (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar7) goto LAB_00588133;
      *puVar9 = 0;
    }
    pNVar6 = __iter.current;
    pSVar2 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
             ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    __iter.list = (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    if ((undefined1  [8])pSVar2 == local_48) break;
    __iter.list = (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)pSVar2;
    ppLVar10 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)local_48);
    RVar1 = (*ppLVar10)->reg;
    BVUnitT<unsigned_long>::AssertRange((uint)RVar1);
    if (((ulong)pSVar12 >> ((ulong)RVar1 & 0x3f) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x16a,"(!bv.Test(lifetime->reg))","!bv.Test(lifetime->reg)");
      if (!bVar7) goto LAB_00588133;
      *puVar9 = 0;
    }
    RVar1 = (*ppLVar10)->reg;
    BVUnitT<unsigned_long>::AssertRange((uint)RVar1);
    if (((*ppLVar10)->field_0x9c & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x16c,"(!lifetime->isOpHelperSpilled)","!lifetime->isOpHelperSpilled");
      if (!bVar7) goto LAB_00588133;
      *puVar9 = 0;
    }
    if (((*ppLVar10)->field_0x9c & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x16d,"(!lifetime->isSpilled)","!lifetime->isSpilled");
      if (!bVar7) goto LAB_00588133;
      *puVar9 = 0;
    }
    if ((*ppLVar10)->end < uVar14) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x16e,"(lifetime->end >= lastend)","lifetime->end >= lastend");
      if (!bVar7) goto LAB_00588133;
      *puVar9 = 0;
    }
    pSVar12 = (Type)((ulong)pSVar12 | 1L << ((ulong)RVar1 & 0x3f));
    uVar14 = (*ppLVar10)->end;
  }
  if (pSVar12 != __iter.current[4].next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x174,"(bv.Equal(this->activeRegs))","bv.Equal(this->activeRegs)");
    if (!bVar7) {
LAB_00588133:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar9 = 0;
  }
  pSVar12 = pNVar6[4].next;
  if (pSVar12 == (Type)0x0) {
    iVar11 = 0;
    iVar13 = 0;
  }
  else {
    uVar15 = 0;
    if (pSVar12 != (Type)0x0) {
      for (; ((ulong)pSVar12 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
      }
    }
    iVar13 = 0;
    iVar11 = 0;
    do {
      BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar15);
      pSVar12 = (Type)((ulong)pSVar12 & ~(1L << (uVar15 & 0x3f)));
      bVar7 = IRType_IsFloat(RegTypes[uVar15 & 0xffffffff]);
      iVar11 = iVar11 + (uint)bVar7;
      iVar13 = iVar13 + (uint)!bVar7;
      lVar4 = 0;
      if (pSVar12 != (Type)0x0) {
        for (; ((ulong)pSVar12 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
        }
      }
      uVar15 = (ulong)(-(uint)(pSVar12 == (Type)0x0) | (uint)lVar4);
    } while (pSVar12 != (Type)0x0);
  }
  if (iVar13 != *(int *)&__iter.current[0x11].next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x183,"(ints == this->intRegUsedCount)","ints == this->intRegUsedCount");
    if (!bVar7) goto LAB_00588133;
    *puVar9 = 0;
  }
  pNVar6 = __iter.current;
  if (iVar11 != *(int *)((long)&__iter.current[0x11].next + 4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x184,"(floats == this->floatRegUsedCount)",
                       "floats == this->floatRegUsedCount");
    if (!bVar7) goto LAB_00588133;
    *puVar9 = 0;
  }
  iVar11 = *(int *)((long)&pNVar6[0x11].next + 4);
  iVar13 = *(int *)&pNVar6[0x11].next;
  BVar8 = BVUnitT<unsigned_long>::CountBit((UnitWord64)pNVar6[4].next);
  if (iVar11 + iVar13 != BVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x185,
                       "((this->intRegUsedCount + this->floatRegUsedCount) == this->activeRegs.Count())"
                       ,
                       "(this->intRegUsedCount + this->floatRegUsedCount) == this->activeRegs.Count()"
                      );
    if (!bVar7) goto LAB_00588133;
    *puVar9 = 0;
  }
  local_48 = (undefined1  [8])__iter.current[0x53].next;
  __iter.list = (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_48;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  pSVar12 = (Type)0x0;
  uVar14 = 0;
  do {
    if (__iter.list == (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar7) goto LAB_00588133;
      *puVar9 = 0;
    }
    pNVar6 = __iter.current;
    pSVar2 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
             ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    __iter.list = (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    if ((undefined1  [8])pSVar2 == local_48) {
      if (pSVar12 != __iter.current[0x52].next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x19a,"(bv.Equal(this->opHelperSpilledRegs))",
                           "bv.Equal(this->opHelperSpilledRegs)");
        if (!bVar7) goto LAB_00588133;
        *puVar9 = 0;
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar15 = 0;
      do {
        BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar15);
        if ((((ulong)pNVar6[0xb].next >> (uVar15 & 0x3f) & 1) != 0) &&
           (uVar15 != *(byte *)((long)&pNVar6[uVar15 + 0x54].next[0x12].next + 4))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x1a0,"(this->tempRegLifetimes[i]->reg == i)",
                             "this->tempRegLifetimes[i]->reg == i");
          if (!bVar7) goto LAB_00588133;
          *puVar9 = 0;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != 0x21);
      pSVar12 = pNVar6[0xd].next;
      if (pSVar12 != (Type)0x0) {
        uVar15 = 0;
        if (pSVar12 != (Type)0x0) {
          for (; ((ulong)pSVar12 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        do {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar15);
          pSVar3 = __iter.current[(uVar15 & 0xffffffff) + 0x75].next;
          if (pSVar3 == (Type)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                               ,0x1a7,"(lifetime)","lifetime");
            if (!bVar7) goto LAB_00588133;
            *puVar9 = 0;
          }
          this_00 = (StackSym *)pSVar3->next;
          if (((ulong)pSVar3[0x13].next & 0x20000000000) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                               ,0x1a9,"(lifetime->isSecondChanceAllocated)",
                               "lifetime->isSecondChanceAllocated");
            if (!bVar7) goto LAB_00588133;
            *puVar9 = 0;
          }
          bVar7 = StackSym::IsConst(this_00);
          if ((!bVar7) && ((this_00->field_0x19 & 0x10) == 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                               ,0x1aa,"(sym->IsConst() || sym->IsAllocated())",
                               "sym->IsConst() || sym->IsAllocated()");
            if (!bVar7) goto LAB_00588133;
            *puVar9 = 0;
          }
          pSVar12 = (Type)((ulong)pSVar12 & ~(1L << (uVar15 & 0x3f)));
          lVar4 = 0;
          if (pSVar12 != (Type)0x0) {
            for (; ((ulong)pSVar12 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          uVar15 = (ulong)(-(uint)(pSVar12 == (Type)0x0) | (uint)lVar4);
        } while (pSVar12 != (Type)0x0);
      }
      return;
    }
    __iter.list = (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)pSVar2;
    ppLVar10 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)local_48);
    RVar1 = (*ppLVar10)->reg;
    BVUnitT<unsigned_long>::AssertRange((uint)RVar1);
    if (((ulong)pSVar12 >> ((ulong)RVar1 & 0x3f) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x18d,"(!bv.Test(lifetime->reg))","!bv.Test(lifetime->reg)");
      if (!bVar7) goto LAB_00588133;
      *puVar9 = 0;
    }
    if (((*ppLVar10)->field_0x9c & 0x40) == 0) {
      RVar1 = (*ppLVar10)->reg;
      BVUnitT<unsigned_long>::AssertRange((uint)RVar1);
      if (((*ppLVar10)->field_0x9c & 0x10) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x191,"(lifetime->isOpHelperSpilled)","lifetime->isOpHelperSpilled");
        if (!bVar7) goto LAB_00588133;
        *puVar9 = 0;
      }
      pSVar12 = (Type)((ulong)pSVar12 | 1L << ((ulong)RVar1 & 0x3f));
      if (((*ppLVar10)->field_0x9c & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x192,"(!lifetime->isSpilled)","!lifetime->isSpilled");
        if (!bVar7) goto LAB_00588133;
        *puVar9 = 0;
      }
    }
    if ((*ppLVar10)->end < uVar14) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x194,"(lifetime->end >= lastend)","lifetime->end >= lastend");
      if (!bVar7) goto LAB_00588133;
      *puVar9 = 0;
    }
    uVar14 = (*ppLVar10)->end;
  } while( true );
}

Assistant:

void
LinearScan::CheckInvariants() const
{
    BitVector bv = this->nonAllocatableRegs;
    uint32 lastend = 0;
    FOREACH_SLIST_ENTRY(Lifetime *, lifetime, this->activeLiveranges)
    {
        // Make sure there are only one lifetime per reg
        Assert(!bv.Test(lifetime->reg));
        bv.Set(lifetime->reg);
        Assert(!lifetime->isOpHelperSpilled);
        Assert(!lifetime->isSpilled);
        Assert(lifetime->end >= lastend);
        lastend = lifetime->end;
    }
    NEXT_SLIST_ENTRY;

    // Make sure the active reg bit vector is correct
    Assert(bv.Equal(this->activeRegs));

    uint ints = 0, floats = 0;
    FOREACH_BITSET_IN_UNITBV(index, this->activeRegs, BitVector)
    {
        if (IRType_IsFloat(RegTypes[index]))
        {
            floats++;
        }
        else
        {
            ints++;
        }
    }
    NEXT_BITSET_IN_UNITBV;
    Assert(ints == this->intRegUsedCount);
    Assert(floats == this->floatRegUsedCount);
    Assert((this->intRegUsedCount + this->floatRegUsedCount) == this->activeRegs.Count());

    bv.ClearAll();

    lastend = 0;
    FOREACH_SLIST_ENTRY(Lifetime *, lifetime, this->opHelperSpilledLiveranges)
    {
        // Make sure there are only one lifetime per reg in the op helper spilled liveranges
        Assert(!bv.Test(lifetime->reg));
        if (!lifetime->cantOpHelperSpill)
        {
            bv.Set(lifetime->reg);
            Assert(lifetime->isOpHelperSpilled);
            Assert(!lifetime->isSpilled);
        }
        Assert(lifetime->end >= lastend);
        lastend = lifetime->end;
    }
    NEXT_SLIST_ENTRY;

    // Make sure the opHelperSpilledRegs bit vector is correct
    Assert(bv.Equal(this->opHelperSpilledRegs));

    for (int i = 0; i < RegNumCount; i++)
    {
        if (this->tempRegs.Test(i))
        {
            Assert(this->tempRegLifetimes[i]->reg == i);
        }
    }

    FOREACH_BITSET_IN_UNITBV(reg, this->secondChanceRegs, BitVector)
    {
        Lifetime *lifetime = this->regContent[reg];
        Assert(lifetime);
        StackSym *sym = lifetime->sym;
        Assert(lifetime->isSecondChanceAllocated);
        Assert(sym->IsConst() || sym->IsAllocated());  // Should have been spilled already.
    } NEXT_BITSET_IN_UNITBV;

}